

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_shared.cpp
# Opt level: O0

void KokkosTools::KernelTimer::increment_counter_region(char *name,KernelExecutionType kType)

{
  bool bVar1;
  KernelPerformanceInfo *this;
  mapped_type *ppKVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>
  local_e0;
  undefined1 local_b1;
  string local_b0;
  KernelPerformanceInfo *local_90;
  KernelPerformanceInfo *info;
  allocator<char> local_79;
  key_type local_78;
  _Self local_58 [3];
  allocator<char> local_39;
  undefined1 local_38 [8];
  string nameStr;
  KernelExecutionType kType_local;
  char *name_local;
  
  nameStr.field_2._12_4_ = kType;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,name,&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,name,&local_79);
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
               *)count_map_abi_cxx11_,&local_78);
  info = (KernelPerformanceInfo *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                *)count_map_abi_cxx11_);
  bVar1 = std::operator==(local_58,(_Self *)&info);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  if (bVar1) {
    this = (KernelPerformanceInfo *)operator_new(0x48);
    local_b1 = 1;
    std::__cxx11::string::string((string *)&local_b0,(string *)local_38);
    KernelPerformanceInfo::KernelPerformanceInfo(this,&local_b0,nameStr.field_2._12_4_);
    local_b1 = 0;
    std::__cxx11::string::~string((string *)&local_b0);
    local_90 = this;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_KokkosTools::KernelTimer::KernelPerformanceInfo_*&,_true>
              (&local_e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               &local_90);
    std::
    map<std::__cxx11::string,KokkosTools::KernelTimer::KernelPerformanceInfo*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,KokkosTools::KernelTimer::KernelPerformanceInfo*>>>
    ::insert<std::pair<std::__cxx11::string,KokkosTools::KernelTimer::KernelPerformanceInfo*>>
              ((map<std::__cxx11::string,KokkosTools::KernelTimer::KernelPerformanceInfo*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,KokkosTools::KernelTimer::KernelPerformanceInfo*>>>
                *)count_map_abi_cxx11_,&local_e0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>
    ::~pair(&local_e0);
    *(KernelPerformanceInfo **)(regions + (long)current_region_level * 8) = local_90;
  }
  else {
    ppKVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                            *)count_map_abi_cxx11_,(key_type *)local_38);
    *(mapped_type *)(regions + (long)current_region_level * 8) = *ppKVar2;
  }
  KernelPerformanceInfo::startTimer
            (*(KernelPerformanceInfo **)(regions + (long)current_region_level * 8));
  current_region_level = current_region_level + 1;
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void increment_counter_region(const char* name, KernelExecutionType kType) {
  std::string nameStr(name);

  if (count_map.find(name) == count_map.end()) {
    KernelPerformanceInfo* info = new KernelPerformanceInfo(nameStr, kType);
    count_map.insert(
        std::pair<std::string, KernelPerformanceInfo*>(nameStr, info));

    regions[current_region_level] = info;
  } else {
    regions[current_region_level] = count_map[nameStr];
  }

  regions[current_region_level]->startTimer();
  current_region_level++;
}